

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.hpp
# Opt level: O1

void __thiscall
csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
Dijkstra(Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *this,
        EnvironmentPtr *env_ptr,double time_limit)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  this->_vptr_Dijkstra = (_func_int **)&PTR_run_0010ecf0;
  (this->env_ptr_).super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (env_ptr->super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var1 = (env_ptr->super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->env_ptr_).super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->params_).start_time_.__d.__r = 0;
  (this->start_vertex_).
  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->start_vertex_).
  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->goal_vertex_).
  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->goal_vertex_).
  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->open_).data_.
  super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->open_).data_.
  super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->open_).data_.
  super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->closed_)._M_h._M_buckets = &(this->closed_)._M_h._M_single_bucket;
  (this->closed_)._M_h._M_bucket_count = 1;
  (this->closed_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->closed_)._M_h._M_element_count = 0;
  (this->closed_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->closed_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->closed_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->path_).
  super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->path_).
  super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->path_).
  super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->planner_stats_).solution_paths_.
  super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->planner_stats_).solution_paths_.
  super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->planner_stats_).solution_paths_.
  super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->params_).time_limit_ = time_limit;
  return;
}

Assistant:

Dijkstra(EnvironmentPtr& env_ptr,
             double time_limit) : env_ptr_(env_ptr)
    {
      params_.time_limit_ = time_limit;
    }